

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<always_comb_named::MainVisitor,_true,_false,_false,_false>::
visit<slang::ast::NetSymbol>
          (ASTVisitor<always_comb_named::MainVisitor,_true,_false,_false,_false> *this,NetSymbol *t)

{
  NetSymbol *in_RSI;
  ASTVisitor<always_comb_named::MainVisitor,_true,_false,_false,_false> *in_RDI;
  
  visitDefault<slang::ast::NetSymbol>(in_RDI,in_RSI);
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (!VisitBad && requires { t.bad(); }) {
            if (t.bad())
                return;
        }

        if constexpr (requires { (DERIVED).handle(t); })
            (DERIVED).handle(t);
        else if constexpr (requires { (DERIVED)(DERIVED, t); })
            (DERIVED)(DERIVED, t);
        else
            visitDefault(t);
    }